

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O0

Error __thiscall asmjit::_abi_1_10::BaseEmitter::onAttach(BaseEmitter *this,CodeHolder *code)

{
  Arch AVar1;
  OperandSignature OVar2;
  Environment *pEVar3;
  CodeHolder *in_RSI;
  BaseEmitter *in_RDI;
  RegType nativeRegType;
  ArchTraits *archTraits;
  undefined7 in_stack_ffffffffffffffc8;
  EmitterFlags in_stack_ffffffffffffffcf;
  
  in_RDI->_code = in_RSI;
  pEVar3 = CodeHolder::environment(in_RSI);
  in_RDI->_environment = *pEVar3;
  _addEmitterFlags(in_RDI,in_stack_ffffffffffffffcf);
  AVar1 = CodeHolder::arch((CodeHolder *)0x12b68b);
  ArchTraits::byArch(AVar1);
  AVar1 = CodeHolder::arch((CodeHolder *)0x12b6a2);
  Environment::is32Bit(AVar1);
  OVar2 = ArchTraits::regTypeToSignature
                    ((ArchTraits *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
                     kNone);
  (in_RDI->_gpSignature)._bits = OVar2._bits;
  (*in_RDI->_vptr_BaseEmitter[0x12])();
  return 0;
}

Assistant:

Error BaseEmitter::onAttach(CodeHolder* code) noexcept {
  _code = code;
  _environment = code->environment();
  _addEmitterFlags(EmitterFlags::kAttached);

  const ArchTraits& archTraits = ArchTraits::byArch(code->arch());
  RegType nativeRegType = Environment::is32Bit(code->arch()) ? RegType::kGp32 : RegType::kGp64;
  _gpSignature = archTraits.regTypeToSignature(nativeRegType);

  onSettingsUpdated();
  return kErrorOk;
}